

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_onewaycouple_mri.c
# Opt level: O0

int err(N_Vector y,N_Vector ytrue,sunrealtype *e)

{
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 uVar1;
  
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RDI,in_RSI,in_RSI);
  uVar1 = N_VMaxNorm(in_RSI);
  *in_RDX = uVar1;
  return 0;
}

Assistant:

static int err(N_Vector y, N_Vector ytrue, sunrealtype* e)
{
  /* compute the error and store it in ytrue */
  N_VLinearSum(SUN_RCONST(1.0), y, SUN_RCONST(-1.0), ytrue, ytrue);

  /* compute the max norm of the error */
  *e = N_VMaxNorm(ytrue);

  /* return with success */
  return (0);
}